

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

CppTypeName *
kj::_::
CopyConstructArray_<capnp::(anonymous_namespace)::CppTypeName,_capnp::(anonymous_namespace)::CppTypeName_*,_false,_false>
::apply(CppTypeName *pos,CppTypeName *start,CppTypeName *end)

{
  CppTypeName *pCVar1;
  undefined1 local_30 [8];
  ExceptionGuard guard;
  CppTypeName *end_local;
  CppTypeName *start_local;
  CppTypeName *pos_local;
  
  guard.pos = end;
  ExceptionGuard::ExceptionGuard((ExceptionGuard *)local_30,pos);
  end_local = start;
  while (pCVar1 = guard.start, end_local != guard.pos) {
    ctor<capnp::(anonymous_namespace)::CppTypeName,capnp::(anonymous_namespace)::CppTypeName&>
              (guard.start,end_local);
    guard.start = guard.start + 1;
    end_local = end_local + 1;
  }
  local_30 = (undefined1  [8])guard.start;
  ExceptionGuard::~ExceptionGuard((ExceptionGuard *)local_30);
  return pCVar1;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(*start);

    if (noexcept(T(*start))) {
      while (start != end) {
        ctor(*pos++, *start++);
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, *start++);
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }